

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall FfsParser::parsePeImageSectionBody(FfsParser *this,UModelIndex *index)

{
  uint *puVar1;
  _Alloc_hider _Var2;
  uint *puVar3;
  CBString info;
  UByteArray body;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar4;
  CBString local_108;
  CBString local_f0;
  UByteArray local_d8;
  CBString local_b8;
  CBString local_a0;
  CBString local_88;
  CBString local_70;
  CBString local_58;
  CBString local_40;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if (index->r < 0) {
    return 1;
  }
  if (index->c < 0) {
    return 1;
  }
  if (index->m == (TreeModel *)0x0) {
    return 1;
  }
  TreeModel::body(&local_d8,this->model,index);
  if (((uint)local_d8.d._M_string_length & 0xffffffc0) == 0) {
    usprintf(&local_f0,"%s: section body size is smaller than DOS header size",
             "parsePeImageSectionBody");
    msg(this,&local_f0,index);
  }
  else {
    Bstrlib::CBString::CBString(&local_f0);
    _Var2._M_p = local_d8.d._M_dataplus._M_p;
    if (*(ushort *)local_d8.d._M_dataplus._M_p == 0x5a4d) {
      if ((long)(int)(uint)local_d8.d._M_string_length <
          (long)(ulong)*(uint *)(local_d8.d._M_dataplus._M_p + 0x3c)) {
        Bstrlib::CBString::CBString(&local_108,"\nDOS header: invalid");
        Bstrlib::CBString::operator+=(&local_f0,&local_108);
        Bstrlib::CBString::~CBString(&local_108);
        usprintf(&local_108,"%s: PE32 image with invalid DOS header","parsePeImageSectionBody");
        msg(this,&local_108,index);
      }
      else {
        puVar3 = (uint *)(local_d8.d._M_dataplus._M_p +
                         *(uint *)(local_d8.d._M_dataplus._M_p + 0x3c));
        if (*puVar3 == 0x4550) {
          if ((long)(int)(uint)local_d8.d._M_string_length <
              (long)(puVar3 + 1) - (long)local_d8.d._M_dataplus._M_p) {
            Bstrlib::CBString::CBString(&local_108,"\nPE header: invalid");
            Bstrlib::CBString::operator+=(&local_f0,&local_108);
            Bstrlib::CBString::~CBString(&local_108);
            usprintf(&local_108,"%s: PE32 image with invalid PE header","parsePeImageSectionBody");
            msg(this,&local_108,index);
            Bstrlib::CBString::~CBString(&local_108);
            TreeModel::addInfo(this->model,index,&local_f0,true);
          }
          else {
            usprintf(&local_70,"\nDOS signature: %04Xh\nPE signature: %08Xh",
                     (ulong)*(ushort *)local_d8.d._M_dataplus._M_p,(ulong)*puVar3);
            Bstrlib::CBString::CBString(&local_88,"\nMachine type: ");
            Bstrlib::CBString::operator+(&local_58,&local_70,&local_88);
            machineTypeToUString(&local_a0,(UINT16)puVar3[1]);
            Bstrlib::CBString::operator+(&local_40,&local_58,&local_a0);
            usprintf(&local_b8,"\nNumber of sections: %u\nCharacteristics: %04Xh",
                     (ulong)*(ushort *)((long)puVar3 + 6),(ulong)*(ushort *)((long)puVar3 + 0x16));
            Bstrlib::CBString::operator+(&local_108,&local_40,&local_b8);
            Bstrlib::CBString::operator+=(&local_f0,&local_108);
            Bstrlib::CBString::~CBString(&local_108);
            Bstrlib::CBString::~CBString(&local_b8);
            Bstrlib::CBString::~CBString(&local_40);
            Bstrlib::CBString::~CBString(&local_a0);
            Bstrlib::CBString::~CBString(&local_58);
            Bstrlib::CBString::~CBString(&local_88);
            Bstrlib::CBString::~CBString(&local_70);
            puVar1 = puVar3 + 6;
            if ((long)(int)(uint)local_d8.d._M_string_length < (long)puVar1 - (long)_Var2._M_p) {
              Bstrlib::CBString::CBString(&local_108,"\nPE optional header: invalid");
              Bstrlib::CBString::operator+=(&local_f0,&local_108);
              Bstrlib::CBString::~CBString(&local_108);
              usprintf(&local_108,"%s: PE32 image with invalid PE optional header",
                       "parsePeImageSectionBody");
              msg(this,&local_108,index);
            }
            else if ((ushort)*puVar1 == 0x20b) {
              usprintf(&local_108,
                       "\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %lXh"
                       ,(ulong)(ushort)puVar3[6],(ulong)(ushort)puVar3[0x17],(ulong)puVar3[10],
                       (ulong)puVar3[0xb],*(undefined8 *)(puVar3 + 0xc));
              Bstrlib::CBString::operator+=(&local_f0,&local_108);
            }
            else if ((ushort)*puVar1 == 0x10b) {
              usprintf(&local_108,
                       "\nOptional header signature: %04Xh\nSubsystem: %04Xh\nAddress of entry point: %Xh\nBase of code: %Xh\nImage base: %Xh"
                       ,(ulong)(ushort)puVar3[6],(ulong)(ushort)puVar3[0x17],(ulong)puVar3[10],
                       (ulong)puVar3[0xb],CONCAT44(uVar4,puVar3[0xd]));
              Bstrlib::CBString::operator+=(&local_f0,&local_108);
            }
            else {
              usprintf(&local_108,"\nOptional header signature: %04Xh, unknown",
                       (ulong)(ushort)*puVar1);
              Bstrlib::CBString::operator+=(&local_f0,&local_108);
              Bstrlib::CBString::~CBString(&local_108);
              usprintf(&local_108,"%s: PE32 image with invalid optional PE header signature",
                       "parsePeImageSectionBody");
              msg(this,&local_108,index);
            }
            Bstrlib::CBString::~CBString(&local_108);
            TreeModel::addInfo(this->model,index,&local_f0,true);
          }
          goto LAB_001358f2;
        }
        usprintf(&local_108,"\nPE signature: %08Xh, invalid",(ulong)*puVar3);
        Bstrlib::CBString::operator+=(&local_f0,&local_108);
        Bstrlib::CBString::~CBString(&local_108);
        usprintf(&local_108,"%s: PE32 image with invalid PE signature","parsePeImageSectionBody");
        msg(this,&local_108,index);
      }
      Bstrlib::CBString::~CBString(&local_108);
      TreeModel::addInfo(this->model,index,&local_f0,true);
    }
    else {
      usprintf(&local_108,"\nDOS signature: %04Xh, invalid",
               (ulong)*(ushort *)local_d8.d._M_dataplus._M_p);
      Bstrlib::CBString::operator+=(&local_f0,&local_108);
      Bstrlib::CBString::~CBString(&local_108);
      usprintf(&local_108,"%s: PE32 image with invalid DOS signature","parsePeImageSectionBody");
      msg(this,&local_108,index);
      Bstrlib::CBString::~CBString(&local_108);
      TreeModel::addInfo(this->model,index,&local_f0,true);
    }
  }
LAB_001358f2:
  Bstrlib::CBString::~CBString(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.d._M_dataplus._M_p != &local_d8.d.field_2) {
    operator_delete(local_d8.d._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

std::vector<std::pair<std::vector<UString>, UModelIndex> > FfsParser::getFitTable() const
{
    return fitParser->getFitTable();
}